

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndIfCommand.cxx
# Opt level: O0

bool __thiscall
cmEndIfCommand::InitialPass
          (cmEndIfCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  char *__nptr;
  double dVar1;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *versionValue;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_1_local;
  cmEndIfCommand *this_local;
  
  this_00 = (this->super_cmCommand).Makefile;
  versionValue = &param_2->ReturnInvoked;
  param_2_local = (cmExecutionStatus *)param_1;
  param_1_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_51);
  __nptr = cmMakefile::GetDefinition(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((__nptr != (char *)0x0) && (local_30 = __nptr, dVar1 = atof(__nptr), 1.4 < dVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,
               "An ENDIF command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
               ,&local_89);
    cmCommand::SetError(&this->super_cmCommand,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    return false;
  }
  return true;
}

Assistant:

bool cmEndIfCommand::InitialPass(std::vector<std::string> const&,
                                 cmExecutionStatus &)
{
  const char* versionValue
    = this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
  if (!versionValue || (atof(versionValue) <= 1.4))
    {
    return true;
    }

  this->SetError("An ENDIF command was found outside of a proper "
                 "IF ENDIF structure. Or its arguments did not match "
                 "the opening IF command.");
  return false;
}